

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O3

void __thiscall Frame::Frame(Frame *this,size_t length,void *data)

{
  _Head_base<0UL,_unsigned_char_*,_false> __dest;
  
  __dest._M_head_impl = (uchar *)operator_new__(length);
  (this->m_Data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __dest._M_head_impl;
  this->m_Size = length;
  this->m_Pos = __dest._M_head_impl + length;
  this->m_OriginalSize = length;
  if (data != (void *)0x0) {
    this->m_Pos = __dest._M_head_impl;
    memcpy(__dest._M_head_impl,data,length);
    return;
  }
  return;
}

Assistant:

Frame::Frame(size_t length, const void* data)
    : m_Data(new uint8_t[length])
{
    m_Size = m_Data ? length : 0;
    m_Pos = m_Data.get() + m_Size;
    m_OriginalSize = m_Size;

    if (m_Pos && data) {
        m_Pos -= length;
        memcpy(m_Pos, data, length);
    }
}